

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O2

void htmlNodeDumpFormatOutput
               (xmlOutputBufferPtr buf,xmlDocPtr doc,xmlNodePtr cur,char *encoding,int format)

{
  xmlElementType xVar1;
  _xmlNode *p_Var2;
  xmlAttrPtr cur_00;
  xmlNodePtr pxVar3;
  int iVar4;
  htmlElemDesc *phVar5;
  xmlNodePtr pxVar6;
  char *str;
  xmlChar *pxVar7;
  _xmlAttr **pp_Var8;
  xmlNodePtr pxVar9;
  bool bVar10;
  
  xmlInitParser();
  if (buf == (xmlOutputBufferPtr)0x0 || cur == (xmlNodePtr)0x0) {
    return;
  }
  pxVar3 = cur;
  pxVar6 = cur->parent;
LAB_001693b8:
  pxVar9 = pxVar3;
  p_Var2 = pxVar6;
  switch(pxVar9->type) {
  case XML_ELEMENT_NODE:
    if ((pxVar9->parent != pxVar6) && (pxVar9->children != (_xmlNode *)0x0)) {
      htmlNodeDumpFormatOutput(buf,doc,pxVar9,encoding,format);
      goto switchD_001693da_caseD_6;
    }
    if (pxVar9->ns == (xmlNs *)0x0) {
      phVar5 = htmlTagLookup(pxVar9->name);
    }
    else {
      phVar5 = (htmlElemDesc *)0x0;
    }
    xmlOutputBufferWriteString(buf,"<");
    if ((pxVar9->ns != (xmlNs *)0x0) && (pxVar7 = pxVar9->ns->prefix, pxVar7 != (xmlChar *)0x0)) {
      xmlOutputBufferWriteString(buf,(char *)pxVar7);
      xmlOutputBufferWriteString(buf,":");
    }
    xmlOutputBufferWriteString(buf,(char *)pxVar9->name);
    if (pxVar9->nsDef != (xmlNsPtr)0x0) {
      xmlNsListDumpOutput(buf,pxVar9->nsDef);
    }
    pp_Var8 = &pxVar9->properties;
    while (cur_00 = *pp_Var8, cur_00 != (xmlAttrPtr)0x0) {
      htmlAttrDumpOutput(buf,doc,cur_00);
      pp_Var8 = &cur_00->next;
    }
    if (phVar5 == (htmlElemDesc *)0x0) {
      if (pxVar9->children != (_xmlNode *)0x0) {
LAB_001698df:
        xmlOutputBufferWriteString(buf,">");
        if (((format != 0) && (phVar5 != (htmlElemDesc *)0x0)) && (phVar5->isinline == '\0')) {
          p_Var2 = pxVar9->children;
          xVar1 = p_Var2->type;
          if (((xVar1 != XML_TEXT_NODE) && (xVar1 != XML_ENTITY_REF_NODE)) &&
             ((p_Var2 != pxVar9->last &&
              ((pxVar9->name != (xmlChar *)0x0 && (*pxVar9->name != 'p')))))) {
            xmlOutputBufferWriteString(buf,"\n");
          }
        }
        pxVar3 = pxVar9->children;
        pxVar6 = pxVar9;
        goto LAB_001693b8;
      }
LAB_00169914:
      xmlOutputBufferWriteString(buf,"></");
      if ((pxVar9->ns != (xmlNs *)0x0) && (pxVar7 = pxVar9->ns->prefix, pxVar7 != (xmlChar *)0x0)) {
        xmlOutputBufferWriteString(buf,(char *)pxVar7);
        xmlOutputBufferWriteString(buf,":");
      }
      xmlOutputBufferWriteString(buf,(char *)pxVar9->name);
    }
    else if (phVar5->empty == '\0') {
      if (pxVar9->children != (_xmlNode *)0x0) goto LAB_001698df;
      if (((phVar5->saveEndTag == '\0') ||
          (iVar4 = xmlStrcmp((xmlChar *)phVar5->name,"html"), iVar4 == 0)) ||
         (iVar4 = xmlStrcmp((xmlChar *)phVar5->name,"body"), iVar4 == 0)) goto LAB_00169914;
    }
    xmlOutputBufferWriteString(buf,">");
    if (((format == 0) || (pxVar9->next == (_xmlNode *)0x0 || phVar5 == (htmlElemDesc *)0x0)) ||
       ((phVar5->isinline != '\0' ||
        ((((xVar1 = pxVar9->next->type, xVar1 == XML_TEXT_NODE ||
           (pxVar6 == (xmlNodePtr)0x0 || xVar1 == XML_ENTITY_REF_NODE)) ||
          (pxVar6->name == (xmlChar *)0x0)) || (*pxVar6->name == 'p'))))))
    goto switchD_001693da_caseD_6;
    pxVar7 = "\n";
    break;
  case XML_ATTRIBUTE_NODE:
    htmlAttrDumpOutput(buf,doc,(xmlAttrPtr)pxVar9);
    goto switchD_001693da_caseD_6;
  case XML_TEXT_NODE:
    pxVar7 = pxVar9->content;
    if (pxVar7 == (xmlChar *)0x0) goto switchD_001693da_caseD_6;
    if (pxVar9->name != "textnoenc") {
      if (pxVar6 == (xmlNodePtr)0x0) {
LAB_001694aa:
        pxVar7 = xmlEncodeEntitiesReentrant(doc,pxVar7);
        if (pxVar7 == (xmlChar *)0x0) {
          buf->error = 2;
          return;
        }
        xmlOutputBufferWriteString(buf,(char *)pxVar7);
        (*xmlFree)(pxVar7);
        goto switchD_001693da_caseD_6;
      }
      iVar4 = xmlStrcasecmp(pxVar6->name,"script");
      if (iVar4 == 0) {
        pxVar7 = pxVar9->content;
      }
      else {
        iVar4 = xmlStrcasecmp(pxVar6->name,"style");
        pxVar7 = pxVar9->content;
        if (iVar4 != 0) goto LAB_001694aa;
      }
    }
    break;
  case XML_CDATA_SECTION_NODE:
    pxVar7 = pxVar9->content;
    if (pxVar7 == (xmlChar *)0x0) goto switchD_001693da_caseD_6;
    break;
  case XML_ENTITY_REF_NODE:
    xmlOutputBufferWriteString(buf,"&");
    xmlOutputBufferWriteString(buf,(char *)pxVar9->name);
    pxVar7 = ";";
    break;
  default:
    goto switchD_001693da_caseD_6;
  case XML_PI_NODE:
    if (pxVar9->name == (xmlChar *)0x0) goto switchD_001693da_caseD_6;
    xmlOutputBufferWriteString(buf,"<?");
    xmlOutputBufferWriteString(buf,(char *)pxVar9->name);
    if (pxVar9->content != (xmlChar *)0x0) {
      xmlOutputBufferWriteString(buf," ");
      xmlOutputBufferWriteString(buf,(char *)pxVar9->content);
    }
    pxVar7 = ">";
    break;
  case XML_COMMENT_NODE:
    if (pxVar9->content == (xmlChar *)0x0) goto switchD_001693da_caseD_6;
    xmlOutputBufferWriteString(buf,"<!--");
    xmlOutputBufferWriteString(buf,(char *)pxVar9->content);
    pxVar7 = "-->";
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    pxVar7 = pxVar9->content;
    if (pxVar7 != (xmlChar *)0x0) {
      xmlOutputBufferWriteString(buf,"<!DOCTYPE ");
      xmlOutputBufferWriteString(buf,*(char **)(pxVar7 + 0x10));
      if (*(long *)(pxVar7 + 0x68) == 0) {
        if ((*(xmlChar **)(pxVar7 + 0x70) != (xmlChar *)0x0) &&
           (iVar4 = xmlStrcmp(*(xmlChar **)(pxVar7 + 0x70),(xmlChar *)"about:legacy-compat"),
           iVar4 != 0)) {
          str = " SYSTEM ";
          goto LAB_001697a5;
        }
      }
      else {
        xmlOutputBufferWriteString(buf," PUBLIC ");
        xmlOutputBufferWriteQuotedString(buf,*(xmlChar **)(pxVar7 + 0x68));
        if (*(long *)(pxVar7 + 0x70) != 0) {
          str = " ";
LAB_001697a5:
          xmlOutputBufferWriteString(buf,str);
          xmlOutputBufferWriteQuotedString(buf,*(xmlChar **)(pxVar7 + 0x70));
        }
      }
      xmlOutputBufferWriteString(buf,">\n");
    }
    if (pxVar9->children == (_xmlNode *)0x0) {
      xmlOutputBufferWriteString(buf,"\n");
      goto switchD_001693da_caseD_6;
    }
    bVar10 = pxVar9->parent != pxVar6;
    pxVar3 = pxVar9->children;
    pxVar6 = pxVar9;
    if (bVar10) {
switchD_001693da_caseD_6:
      pxVar6 = p_Var2;
      if (pxVar9 == cur) {
        return;
      }
      pxVar3 = pxVar9->next;
      if (pxVar9->next == (_xmlNode *)0x0) {
        p_Var2 = pxVar6->parent;
        pxVar9 = pxVar6;
        if ((pxVar6->type | XML_CDATA_SECTION_NODE) != XML_HTML_DOCUMENT_NODE) goto LAB_00169616;
        goto LAB_00169602;
      }
    }
    goto LAB_001693b8;
  }
  xmlOutputBufferWriteString(buf,(char *)pxVar7);
  goto switchD_001693da_caseD_6;
LAB_00169616:
  if (((format == 0) || (pxVar6->ns != (xmlNs *)0x0)) ||
     (phVar5 = htmlTagLookup(pxVar6->name), phVar5 == (htmlElemDesc *)0x0)) {
    bVar10 = false;
    phVar5 = (htmlElemDesc *)0x0;
  }
  else {
    bVar10 = true;
    if (phVar5->isinline == '\0') {
      xVar1 = pxVar6->last->type;
      if (((xVar1 != XML_TEXT_NODE) && (xVar1 != XML_ENTITY_REF_NODE)) &&
         ((pxVar6->children != pxVar6->last &&
          ((pxVar6->name != (xmlChar *)0x0 && (*pxVar6->name != 'p')))))) {
        xmlOutputBufferWriteString(buf,"\n");
      }
    }
  }
  xmlOutputBufferWriteString(buf,"</");
  if ((pxVar6->ns != (xmlNs *)0x0) && (pxVar7 = pxVar6->ns->prefix, pxVar7 != (xmlChar *)0x0)) {
    xmlOutputBufferWriteString(buf,(char *)pxVar7);
    xmlOutputBufferWriteString(buf,":");
  }
  xmlOutputBufferWriteString(buf,(char *)pxVar6->name);
  xmlOutputBufferWriteString(buf,">");
  if ((((bVar10) && (phVar5->isinline == '\0')) && (pxVar6->next != (_xmlNode *)0x0)) &&
     (((xVar1 = pxVar6->next->type, xVar1 != XML_TEXT_NODE &&
       (p_Var2 != (_xmlNode *)0x0 && xVar1 != XML_ENTITY_REF_NODE)) &&
      ((p_Var2->name != (xmlChar *)0x0 && (*p_Var2->name != 'p')))))) {
LAB_00169602:
    xmlOutputBufferWriteString(buf,"\n");
  }
  goto switchD_001693da_caseD_6;
}

Assistant:

void
htmlNodeDumpFormatOutput(xmlOutputBufferPtr buf, xmlDocPtr doc,
	                 xmlNodePtr cur, const char *encoding ATTRIBUTE_UNUSED,
                         int format) {
    xmlNodePtr root, parent;
    xmlAttrPtr attr;
    const htmlElemDesc * info;

    xmlInitParser();

    if ((cur == NULL) || (buf == NULL)) {
	return;
    }

    root = cur;
    parent = cur->parent;
    while (1) {
        switch (cur->type) {
        case XML_HTML_DOCUMENT_NODE:
        case XML_DOCUMENT_NODE:
            if (((xmlDocPtr) cur)->intSubset != NULL) {
                htmlDtdDumpOutput(buf, (xmlDocPtr) cur, NULL);
            }
            if (cur->children != NULL) {
                /* Always validate cur->parent when descending. */
                if (cur->parent == parent) {
                    parent = cur;
                    cur = cur->children;
                    continue;
                }
            } else {
                xmlOutputBufferWriteString(buf, "\n");
            }
            break;

        case XML_ELEMENT_NODE:
            /*
             * Some users like lxml are known to pass nodes with a corrupted
             * tree structure. Fall back to a recursive call to handle this
             * case.
             */
            if ((cur->parent != parent) && (cur->children != NULL)) {
                htmlNodeDumpFormatOutput(buf, doc, cur, encoding, format);
                break;
            }

            /*
             * Get specific HTML info for that node.
             */
            if (cur->ns == NULL)
                info = htmlTagLookup(cur->name);
            else
                info = NULL;

            xmlOutputBufferWriteString(buf, "<");
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWriteString(buf, ":");
            }
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutput(buf, cur->nsDef);
            attr = cur->properties;
            while (attr != NULL) {
                htmlAttrDumpOutput(buf, doc, attr);
                attr = attr->next;
            }

            if ((info != NULL) && (info->empty)) {
                xmlOutputBufferWriteString(buf, ">");
            } else if (cur->children == NULL) {
                if ((info != NULL) && (info->saveEndTag != 0) &&
                    (xmlStrcmp(BAD_CAST info->name, BAD_CAST "html")) &&
                    (xmlStrcmp(BAD_CAST info->name, BAD_CAST "body"))) {
                    xmlOutputBufferWriteString(buf, ">");
                } else {
                    xmlOutputBufferWriteString(buf, "></");
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)cur->ns->prefix);
                        xmlOutputBufferWriteString(buf, ":");
                    }
                    xmlOutputBufferWriteString(buf, (const char *)cur->name);
                    xmlOutputBufferWriteString(buf, ">");
                }
            } else {
                xmlOutputBufferWriteString(buf, ">");
                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->children->type != HTML_TEXT_NODE) &&
                    (cur->children->type != HTML_ENTITY_REF_NODE) &&
                    (cur->children != cur->last) &&
                    (cur->name != NULL) &&
                    (cur->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");
                parent = cur;
                cur = cur->children;
                continue;
            }

            if ((format) && (cur->next != NULL) &&
                (info != NULL) && (!info->isinline)) {
                if ((cur->next->type != HTML_TEXT_NODE) &&
                    (cur->next->type != HTML_ENTITY_REF_NODE) &&
                    (parent != NULL) &&
                    (parent->name != NULL) &&
                    (parent->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");
            }

            break;

        case XML_ATTRIBUTE_NODE:
            htmlAttrDumpOutput(buf, doc, (xmlAttrPtr) cur);
            break;

        case HTML_TEXT_NODE:
            if (cur->content == NULL)
                break;
            if (((cur->name == (const xmlChar *)xmlStringText) ||
                 (cur->name != (const xmlChar *)xmlStringTextNoenc)) &&
                ((parent == NULL) ||
                 ((xmlStrcasecmp(parent->name, BAD_CAST "script")) &&
                  (xmlStrcasecmp(parent->name, BAD_CAST "style"))))) {
                xmlChar *buffer;

                buffer = xmlEncodeEntitiesReentrant(doc, cur->content);
                if (buffer == NULL) {
                    buf->error = XML_ERR_NO_MEMORY;
                    return;
                }
                xmlOutputBufferWriteString(buf, (const char *)buffer);
                xmlFree(buffer);
            } else {
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
            }
            break;

        case HTML_COMMENT_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWriteString(buf, "<!--");
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
                xmlOutputBufferWriteString(buf, "-->");
            }
            break;

        case HTML_PI_NODE:
            if (cur->name != NULL) {
                xmlOutputBufferWriteString(buf, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    xmlOutputBufferWriteString(buf, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWriteString(buf, ">");
            }
            break;

        case HTML_ENTITY_REF_NODE:
            xmlOutputBufferWriteString(buf, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWriteString(buf, ";");
            break;

        case HTML_PRESERVE_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
            }
            break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                return;
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            cur = parent;
            /* cur->parent was validated when descending. */
            parent = cur->parent;

            if ((cur->type == XML_HTML_DOCUMENT_NODE) ||
                (cur->type == XML_DOCUMENT_NODE)) {
                xmlOutputBufferWriteString(buf, "\n");
            } else {
                if ((format) && (cur->ns == NULL))
                    info = htmlTagLookup(cur->name);
                else
                    info = NULL;

                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->last->type != HTML_TEXT_NODE) &&
                    (cur->last->type != HTML_ENTITY_REF_NODE) &&
                    (cur->children != cur->last) &&
                    (cur->name != NULL) &&
                    (cur->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");

                xmlOutputBufferWriteString(buf, "</");
                if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                    xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                    xmlOutputBufferWriteString(buf, ":");
                }
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWriteString(buf, ">");

                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->next != NULL)) {
                    if ((cur->next->type != HTML_TEXT_NODE) &&
                        (cur->next->type != HTML_ENTITY_REF_NODE) &&
                        (parent != NULL) &&
                        (parent->name != NULL) &&
                        (parent->name[0] != 'p')) /* p, pre, param */
                        xmlOutputBufferWriteString(buf, "\n");
                }
            }
        }
    }
}